

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

optional<std::basic_string_view<char,_std::char_traits<char>_>_> *
read_name(optional<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
         string_view buf)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar3 = buf._M_str;
  pcVar1 = pcVar3 + buf._M_len;
  pcVar2 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<bool(*)(int)noexcept>>
                     (pcVar3,pcVar1,is_char_name);
  if (pcVar2 == pcVar1) {
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_len = buf._M_len;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_str = pcVar3;
  }
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_engaged = pcVar2 == pcVar1;
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string_view>
read_name(const std::string_view buf) noexcept
{
    return std::find_if_not(std::begin(buf), std::end(buf), is_char_name) ==
               std::end(buf)
             ? std::make_optional(buf)
             : std::nullopt;
}